

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_soc.cpp
# Opt level: O1

RK_U32 mpp_check_soc_cap(MppCtxType type,MppCodingType coding)

{
  MppSocService *pMVar1;
  MppCodingType MVar2;
  MppCodingType MVar3;
  RK_U32 RVar4;
  long lVar5;
  
  RVar4 = 0;
  if (type == MPP_CTX_DEC) {
    lVar5 = 0x88;
  }
  else {
    if (type != MPP_CTX_ENC) {
      return 0;
    }
    lVar5 = 0x8c;
  }
  pMVar1 = MppSocService::get();
  if (*(uint *)(pMVar1->soc_name + lVar5) != 0) {
    MVar3 = coding - 0xfffff0;
    if (coding < MPP_VIDEO_CodingVC1) {
      MVar3 = coding;
    }
    MVar2 = ~MPP_VIDEO_CodingUnused;
    if (coding < MPP_VIDEO_CodingKhronosExtensions) {
      MVar2 = MVar3;
    }
    if ((0x1e < MVar2 - MPP_VIDEO_CodingAutoDetect) ||
       (RVar4 = 1, (*(uint *)(pMVar1->soc_name + lVar5) >> (MVar2 & 0x1f) & 1) == 0)) {
      RVar4 = 0;
    }
  }
  return RVar4;
}

Assistant:

RK_U32 mpp_check_soc_cap(MppCtxType type, MppCodingType coding)
{
    RK_U32 cap = 0;

    if (type == MPP_CTX_DEC)
        cap = MppSocService::get()->get_dec_cap();
    else if (type == MPP_CTX_ENC)
        cap = MppSocService::get()->get_enc_cap();
    else
        return 0;

    if (!cap)
        return 0;

    return is_valid_cap_coding(cap, coding);
}